

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_9::TileBufferTask::execute(TileBufferTask *this)

{
  int *piVar1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  _func_int **pp_Var5;
  bool bVar6;
  PixelType xOffsetForData;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  Data *pDVar13;
  ostream *poVar14;
  InputExc *this_00;
  int iVar15;
  TileBuffer *pTVar16;
  int iVar17;
  ulong uVar18;
  MultiPartInputFile *pMVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  size_t tileLineSize;
  int iVar24;
  Box2i tileRange;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  char *readPtr;
  ostream local_1a8 [376];
  
  pDVar13 = this->_ifd;
  pTVar16 = this->_tileBuffer;
  dataWindowForTile((Imf_2_5 *)&tileRange,&pDVar13->tileDesc,
                    *(int *)&(pDVar13->tileOffsets).field_0xc,
                    *(int *)&(pDVar13->tileOffsets)._offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                    *(int *)((long)&(pDVar13->tileOffsets)._offsets.
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4),
                    *(int *)&(pDVar13->tileOffsets)._offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                    *(int *)((long)&(pTVar16->exception)._M_string_length + 4),
                    *(int *)&(pTVar16->exception).field_2,
                    *(int *)((long)&(pTVar16->exception).field_2 + 4),
                    *(int *)((long)&(pTVar16->exception).field_2 + 8));
  iVar24 = tileRange.max.y;
  iVar9 = tileRange.min.y;
  uVar18 = 0xffffffffffffffff;
  if (-2 < tileRange.max.y - tileRange.min.y) {
    uVar18 = (long)(tileRange.max.y - tileRange.min.y) * 4 + 4;
  }
  pvVar10 = operator_new__(uVar18);
  if (iVar24 < iVar9) {
    tileLineSize = 0;
    iVar15 = 0;
  }
  else {
    iVar15 = 0;
    uVar22 = 0;
    iVar8 = tileRange.max.x;
    iVar17 = iVar9;
    iVar2 = iVar9;
    do {
      *(undefined4 *)((long)pvVar10 + (long)(iVar2 - iVar17) * 4) = 0;
      if (iVar8 < tileRange.min.x) {
        uVar23 = 0;
      }
      else {
        pDVar13 = this->_ifd;
        uVar23 = 0;
        iVar7 = tileRange.min.x;
        do {
          iVar24 = *(int *)((long)(iVar7 - tileRange.min.x *
                                           *(int *)&pDVar13[1].header._map._M_t._M_impl) *
                            (long)*(int *)((long)&pDVar13[1].super_Mutex.super___mutex_base._M_mutex
                                          + 0x18) +
                           (long)(iVar2 - iVar17 * *(int *)&pDVar13[1].header._map._M_t._M_impl.
                                                            field_0x4) *
                           (long)*(int *)((long)&pDVar13[1].super_Mutex.super___mutex_base._M_mutex
                                         + 0x20) +
                           *(long *)((long)&pDVar13[1].super_Mutex.super___mutex_base._M_mutex +
                                    0x10));
          pMVar19 = pDVar13->multiPartFile;
          if ((MultiPartInputFile *)
              (pDVar13->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start != pMVar19) {
            uVar20 = 1;
            uVar18 = 0;
            do {
              pp_Var5 = (&pMVar19->super_GenericInputFile)[uVar18]._vptr_GenericInputFile;
              if (*(char *)(pp_Var5 + 5) == '\0') {
                iVar9 = pixelTypeSize(*(PixelType *)((long)pp_Var5 + 4));
                iVar8 = pixelTypeSize(*(PixelType *)
                                       ((long)(&this->_ifd->multiPartFile->super_GenericInputFile)
                                              [uVar18]._vptr_GenericInputFile + 4));
                iVar15 = iVar15 + iVar9 * iVar24;
                uVar23 = uVar23 + iVar8 * iVar24;
                pDVar13 = this->_ifd;
              }
              uVar18 = (ulong)uVar20;
              pMVar19 = pDVar13->multiPartFile;
              uVar20 = uVar20 + 1;
              iVar9 = tileRange.min.y;
              iVar8 = tileRange.max.x;
            } while (uVar18 < (ulong)((long)(pDVar13->tileBuffers).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)pMVar19 >> 3));
          }
          piVar1 = (int *)((long)pvVar10 + (long)(iVar2 - iVar9) * 4);
          *piVar1 = *piVar1 + iVar24;
          bVar6 = iVar7 < iVar8;
          iVar24 = tileRange.max.y;
          iVar17 = iVar9;
          iVar7 = iVar7 + 1;
        } while (bVar6);
      }
      if ((int)uVar22 < (int)uVar23) {
        uVar22 = uVar23;
      }
      bVar6 = iVar2 < iVar24;
      iVar2 = iVar2 + 1;
    } while (bVar6);
    tileLineSize = (size_t)uVar22;
  }
  plVar3 = (long *)(this->_tileBuffer->exception)._M_dataplus._M_p;
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  pCVar11 = Header::compression(&this->_ifd->header);
  pCVar12 = newTileCompressor(*pCVar11,tileLineSize,(ulong)(this->_ifd->tileDesc).ySize,
                              &this->_ifd->header);
  pTVar16 = this->_tileBuffer;
  (pTVar16->exception)._M_dataplus._M_p = (pointer)pCVar12;
  uVar18._0_4_ = pTVar16->dy;
  uVar18._4_4_ = pTVar16->lx;
  if ((pCVar12 == (Compressor *)0x0) || ((ulong)(long)iVar15 <= uVar18)) {
    *(undefined4 *)&(pTVar16->exception)._M_string_length = 1;
    pTVar16->compressor = *(Compressor **)&pTVar16->format;
  }
  else {
    iVar9 = (*pCVar12->_vptr_Compressor[3])(pCVar12);
    pTVar16 = this->_tileBuffer;
    *(int *)&(pTVar16->exception)._M_string_length = iVar9;
    plVar3 = (long *)(pTVar16->exception)._M_dataplus._M_p;
    uVar4._0_4_ = pTVar16->format;
    uVar4._4_4_ = pTVar16->dx;
    local_1c8 = tileRange.min.x;
    iStack_1c4 = tileRange.min.y;
    iStack_1c0 = tileRange.max.x;
    iStack_1bc = tileRange.max.y;
    iVar9 = (**(code **)(*plVar3 + 0x38))(plVar3,uVar4,pTVar16->dy,&local_1c8,&pTVar16->compressor);
    uVar18 = (ulong)iVar9;
    pTVar16 = this->_tileBuffer;
    pTVar16->dy = (int)uVar18;
    pTVar16->lx = (int)(uVar18 >> 0x20);
  }
  if (uVar18 != (long)iVar15) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&readPtr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"size mismatch when reading deep tile: expected ",0x2f);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"bytes of uncompressed data but got ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(this_00,(stringstream *)&readPtr);
    __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  readPtr = (char *)pTVar16->compressor;
  if (tileRange.min.y <= tileRange.max.y) {
    pDVar13 = this->_ifd;
    iVar24 = tileRange.max.y;
    iVar9 = tileRange.min.y;
    do {
      pMVar19 = pDVar13->multiPartFile;
      if ((MultiPartInputFile *)
          (pDVar13->tileBuffers).
          super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start != pMVar19) {
        uVar18 = 0;
        uVar21 = 1;
        do {
          pp_Var5 = (&pMVar19->super_GenericInputFile)[uVar18]._vptr_GenericInputFile;
          if (*(byte *)((long)pp_Var5 + 0x29) == 1) {
            skipChannel(&readPtr,*(PixelType *)((long)pp_Var5 + 4),
                        (ulong)*(uint *)((long)pvVar10 + ((long)iVar9 - (long)tileRange.min.y) * 4))
            ;
          }
          else {
            iVar24 = *(int *)&pDVar13[1].header._map._M_t._M_impl.field_0x4;
            if (iVar24 != 0) {
              iVar24 = tileRange.min.y;
            }
            iVar2 = *(int *)&pDVar13[1].header._map._M_t._M_impl;
            if (iVar2 != 0) {
              iVar2 = tileRange.min.x;
            }
            iVar15 = tileRange.min.y;
            if (*(PixelType *)((long)pp_Var5 + 0x3c) == UINT) {
              iVar15 = 0;
            }
            xOffsetForData = *(PixelType *)(pp_Var5 + 7);
            if (*(PixelType *)(pp_Var5 + 7) != UINT) {
              xOffsetForData = tileRange.min.x;
            }
            copyIntoDeepFrameBuffer
                      (&readPtr,(char *)pp_Var5[1],
                       *(char **)((long)&pDVar13[1].super_Mutex.super___mutex_base._M_mutex + 0x10),
                       (ptrdiff_t)
                       pDVar13[1].super_Mutex.super___mutex_base._M_mutex.__data.__list.__prev,
                       (ptrdiff_t)
                       pDVar13[1].super_Mutex.super___mutex_base._M_mutex.__data.__list.__next,iVar9
                       ,tileRange.min.x,tileRange.max.x,iVar2,iVar24,xOffsetForData,iVar15,
                       (ptrdiff_t)pp_Var5[4],(ptrdiff_t)pp_Var5[2],(ptrdiff_t)pp_Var5[3],
                       *(bool *)(pp_Var5 + 5),(double)pp_Var5[6],
                       (Format)(this->_tileBuffer->exception)._M_string_length,*(PixelType *)pp_Var5
                       ,*(PixelType *)((long)pp_Var5 + 4));
          }
          pDVar13 = this->_ifd;
          pMVar19 = pDVar13->multiPartFile;
          bVar6 = uVar21 < (ulong)((long)(pDVar13->tileBuffers).
                                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start - (long)pMVar19
                                  >> 3);
          uVar18 = uVar21;
          uVar21 = (ulong)((int)uVar21 + 1);
          iVar24 = tileRange.max.y;
        } while (bVar6);
      }
      bVar6 = iVar9 < iVar24;
      iVar9 = iVar9 + 1;
    } while (bVar6);
  }
  operator_delete__(pvVar10);
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
	// into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //
    
        char *writePtr = _tileBuffer->buffer;
    
        Box2i tileRange = dataWindowForTile (_ofd->tileDesc,
                                                  _ofd->minX, _ofd->maxX,
                                                  _ofd->minY, _ofd->maxY,
                                                  _tileBuffer->tileCoord.dx,
                                                  _tileBuffer->tileCoord.dy,
                                                  _tileBuffer->tileCoord.lx,
                                                  _tileBuffer->tileCoord.ly);
    
        int numScanLines = tileRange.max.y - tileRange.min.y + 1;
        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;
    
        //
        // Iterate over the scan lines in the tile.
        //
        
        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //
    
            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                const TOutSliceInfo &slice = _ofd->slices[i];
    
                //
                // These offsets are used to facilitate both absolute
                // and tile-relative pixel coordinates.
                //
            
                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;
    
		//
		// Fill the tile buffer with pixel data.
		//

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //
    
                    const char *readPtr = slice.base +
                                          (y - yOffset) * slice.yStride +
                                          (tileRange.min.x - xOffset) *
                                          slice.xStride;

                    const char *endPtr  = readPtr +
                                          (numPixelsPerScanLine - 1) *
                                          slice.xStride;
                                        
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        }
        
        //
        // Compress the contents of the tileBuffer, 
        // and store the compressed data in the output file.
        //
    
        _tileBuffer->dataSize = writePtr - _tileBuffer->buffer;
        _tileBuffer->dataPtr = _tileBuffer->buffer;
    
        if (_tileBuffer->compressor)
        {
            const char *compPtr;

            int compSize = _tileBuffer->compressor->compressTile
                                                (_tileBuffer->dataPtr,
                                                 _tileBuffer->dataSize,
                                                 tileRange, compPtr);
    
            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //
    
                convertToXdr (_ofd, _tileBuffer->buffer, numScanLines,
                              numPixelsPerScanLine);
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}